

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threads.c
# Opt level: O1

void xmlRMutexLock(xmlRMutexPtr tok)

{
  int iVar1;
  pthread_t __thread2;
  pthread_t pVar2;
  uint uVar3;
  
  if (tok == (xmlRMutexPtr)0x0) {
    return;
  }
  pthread_mutex_lock((pthread_mutex_t *)tok);
  uVar3 = tok->held;
  if (uVar3 != 0) {
    pVar2 = tok->tid;
    __thread2 = pthread_self();
    iVar1 = pthread_equal(pVar2,__thread2);
    if (iVar1 != 0) {
      uVar3 = uVar3 + 1;
      goto LAB_001481cb;
    }
    tok->waiters = tok->waiters + 1;
    if (tok->held != 0) {
      do {
        pthread_cond_wait((pthread_cond_t *)&tok->cv,(pthread_mutex_t *)tok);
      } while (tok->held != 0);
    }
    tok->waiters = tok->waiters - 1;
  }
  pVar2 = pthread_self();
  tok->tid = pVar2;
  uVar3 = 1;
LAB_001481cb:
  tok->held = uVar3;
  pthread_mutex_unlock((pthread_mutex_t *)tok);
  return;
}

Assistant:

void
xmlRMutexLock(xmlRMutexPtr tok)
{
    if (tok == NULL)
        return;
#ifdef HAVE_POSIX_THREADS
    pthread_mutex_lock(&tok->lock);
    if (tok->held) {
        if (pthread_equal(tok->tid, pthread_self())) {
            tok->held++;
            pthread_mutex_unlock(&tok->lock);
            return;
        } else {
            tok->waiters++;
            while (tok->held)
                pthread_cond_wait(&tok->cv, &tok->lock);
            tok->waiters--;
        }
    }
    tok->tid = pthread_self();
    tok->held = 1;
    pthread_mutex_unlock(&tok->lock);
#elif defined HAVE_WIN32_THREADS
    EnterCriticalSection(&tok->cs);
#endif
}